

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

void __thiscall SQFuncState::AddParameter(SQFuncState *this,SQObject *name)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  SQObjectPtr *p;
  SQObjectType SVar3;
  ulong uVar4;
  SQUnsignedInteger SVar5;
  SQObjectPtr local_20;
  
  PushLocalVariable(this,name);
  local_20.super_SQObject._type = name->_type;
  local_20.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
  SVar3 = local_20.super_SQObject._type & 0x8000000;
  if (SVar3 != 0) {
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  uVar2 = (this->_parameters)._allocated;
  p = (this->_parameters)._vals;
  uVar4 = (this->_parameters)._size;
  if (uVar2 <= uVar4) {
    SVar5 = 4;
    if (uVar4 * 2 != 0) {
      SVar5 = uVar4 * 2;
    }
    p = (SQObjectPtr *)sq_vm_realloc(p,uVar2 << 4,SVar5 << 4);
    (this->_parameters)._vals = p;
    (this->_parameters)._allocated = SVar5;
    uVar4 = (this->_parameters)._size;
    SVar3 = local_20.super_SQObject._type & 0x8000000;
  }
  (this->_parameters)._size = uVar4 + 1;
  p[uVar4].super_SQObject._type = local_20.super_SQObject._type;
  p[uVar4].super_SQObject._unVal.pTable = (SQTable *)local_20.super_SQObject._unVal;
  if (SVar3 != 0) {
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return;
}

Assistant:

void SQFuncState::AddParameter(const SQObject &name)
{
    PushLocalVariable(name);
    _parameters.push_back(name);
}